

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O3

void __thiscall
MaterialSystemTest_testFloatArrayProperty_Test::TestBody
          (MaterialSystemTest_testFloatArrayProperty_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 extraout_EAX;
  int iVar3;
  char *pcVar4;
  uint *pMax_00;
  AssertionResult gtest_ar_;
  uint pMax;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  uint local_5c;
  string local_58;
  float local_38 [4];
  
  local_38[0] = 0.0;
  local_38[1] = 1.0;
  local_38[2] = 2.0;
  local_38[3] = 3.0;
  pMax_00 = &local_5c;
  local_5c = 4;
  aiMaterial::AddBinaryProperty
            ((this->super_MaterialSystemTest).pcMat,local_38,0x10,"testKey2",0,0,aiPTI_Float);
  local_38[0] = 12.0;
  local_38[1] = 12.0;
  local_38[2] = 12.0;
  local_38[3] = 12.0;
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_78.ptr_._4_4_ << 0x20);
  local_80.data_._0_4_ =
       aiGetMaterialFloatArray
                 ((this->super_MaterialSystemTest).pcMat,"testKey2",0,0,local_38,pMax_00);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&local_58,"aiReturn_SUCCESS","pcMat->Get(\"testKey2\",0,0,pf,&pMax)",
             (aiReturn *)&local_78,(aiReturn *)&local_80);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x4f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_58,"sizeof(pf) / sizeof(float)","pMax",(unsigned_long *)&local_78,
             &local_5c);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x50,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar1._4_4_ = -(uint)(local_38[1] != 1.0);
  auVar1._0_4_ = -(uint)(local_38[0] != 0.0);
  auVar1._8_4_ = -(uint)(local_38[2] != 2.0);
  auVar1._12_4_ = -(uint)(local_38[3] != 3.0);
  iVar3 = movmskps(extraout_EAX,auVar1);
  local_78.ptr_._0_1_ = iVar3 == 0;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_78,
               (AssertionResult *)"!pf[0] && 1.0f == pf[1] && 2.0f == pf[2] && 3.0f == pf[3]",
               "false","true",(char *)pMax_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x51,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                      (char)local_58._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p));
    }
    if (CONCAT44(local_80.data_._4_4_,(aiReturn)local_80.data_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_80.data_._4_4_,(aiReturn)local_80.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(aiReturn)local_80.data_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testFloatArrayProperty)
{
    float pf[] = {0.0f,1.0f,2.0f,3.0f};
    unsigned int pMax = sizeof(pf) / sizeof(float);
    this->pcMat->AddProperty(pf,pMax,"testKey2");
    pf[0] = pf[1] = pf[2] = pf[3] = 12.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey2",0,0,pf,&pMax));
    EXPECT_EQ(sizeof(pf) / sizeof(float), pMax);
    EXPECT_TRUE(!pf[0] && 1.0f == pf[1] && 2.0f == pf[2] && 3.0f == pf[3] );
}